

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * doctest::detail::tlssPop(void)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  char *pcVar6;
  String *in_RDI;
  long *in_FS_OFFSET;
  logic_error local_40 [16];
  
  g_infoContexts::__tls_init();
  lVar1 = in_FS_OFFSET[-0x3a];
  if (in_FS_OFFSET[-0x3b] != lVar1) {
    lVar2 = *in_FS_OFFSET;
    uVar3 = *(undefined8 *)(lVar1 + -0x10);
    uVar4 = *(undefined8 *)(lVar1 + -8);
    in_FS_OFFSET[-0x3a] = lVar1 + -0x10;
    iVar5 = std::ostream::tellp();
    (**(code **)(in_FS_OFFSET[-0x35] + 0x28))(lVar2 + -0x1a8,uVar3,uVar4,0x18);
    pcVar6 = String::allocate(in_RDI,iVar5 - (int)uVar3);
    std::istream::read((char *)(lVar2 + -0x1c0),(long)pcVar6);
    return in_RDI;
  }
  std::logic_error::logic_error
            (local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]cinatra/tests/doctest/doctest.h:3173: Internal doctest error: TLSS was empty when trying to pop!"
            );
  anon_unknown_14::throw_exception<std::logic_error>(local_40);
}

Assistant:

String tlssPop() {
        return g_oss.pop();
    }